

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_dictContentType_e dictContentType;
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ZSTD_allocFunction p_Var16;
  ZSTD_freeFunction p_Var17;
  ZSTD_customMem cMem;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params params;
  ZSTD_CCtx_params params_00;
  size_t err_code;
  ZSTD_CDict *pZVar18;
  ZSTDMT_CCtx *pZVar19;
  size_t sVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  size_t sVar24;
  void *pvVar25;
  undefined8 *puVar26;
  undefined8 *puVar27;
  unsigned_long_long uVar28;
  char *dst;
  char *pcVar29;
  ulong uVar30;
  void *src;
  uint uVar31;
  ulong uVar32;
  char *dst_00;
  bool bVar33;
  bool bVar34;
  byte bVar35;
  uint in_stack_fffffffffffffd08;
  uint in_stack_fffffffffffffd0c;
  uint in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd14;
  uint in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  ZSTD_strategy in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  ZSTD_allocFunction in_stack_fffffffffffffd28;
  ZSTD_freeFunction in_stack_fffffffffffffd30;
  void *in_stack_fffffffffffffd38;
  undefined1 auVar36 [24];
  undefined1 in_stack_fffffffffffffd40 [88];
  undefined1 auVar37 [24];
  size_t local_258;
  ulong local_248;
  undefined1 local_208 [8];
  uint uStack_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  ZSTD_strategy ZStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined8 uStack_1c4;
  ZSTD_compressionParameters local_1b8;
  size_t local_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  ZSTD_allocFunction p_Stack_170;
  ZSTD_freeFunction p_Stack_168;
  void *pvStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined4 uStack_130;
  undefined4 local_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined8 uStack_114;
  uint local_10c;
  size_t local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  ZSTD_allocFunction p_Stack_e0;
  ZSTD_freeFunction p_Stack_d8;
  void *pvStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined4 uStack_a0;
  undefined4 local_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  uint local_7c;
  size_t local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ZSTD_allocFunction p_Stack_50;
  ZSTD_freeFunction p_Stack_48;
  void *pvStack_40;
  
  bVar35 = 0;
  if (output->size < output->pos) {
    return 0xffffffffffffffff;
  }
  if (input->size < input->pos) {
    return 0xffffffffffffffff;
  }
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx!=NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x39a7,
                  "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (cctx->streamStage != zcss_init) goto LAB_0014e95c;
  uVar4 = (cctx->requestedParams).format;
  uVar5 = (cctx->requestedParams).cParams.windowLog;
  uVar6 = (cctx->requestedParams).cParams.chainLog;
  uVar7 = (cctx->requestedParams).cParams.hashLog;
  uVar8 = (cctx->requestedParams).cParams.searchLog;
  uVar9 = (cctx->requestedParams).cParams.minMatch;
  uVar10 = (cctx->requestedParams).cParams.targetLength;
  uVar11 = (cctx->requestedParams).cParams.strategy;
  local_1e8._0_4_ = (cctx->requestedParams).fParams.contentSizeFlag;
  local_1e8._4_4_ = (cctx->requestedParams).fParams.checksumFlag;
  uVar12 = (cctx->requestedParams).compressionLevel;
  uVar13 = (cctx->requestedParams).forceWindow;
  uVar14 = *(undefined8 *)&(cctx->requestedParams).field_0x34;
  uVar15 = *(undefined8 *)((long)&(cctx->requestedParams).targetCBlockSize + 4);
  uStack_1c4._0_4_ = (cctx->requestedParams).attachDictPref;
  uStack_1c4._4_4_ = (cctx->requestedParams).literalCompressionMode;
  uStack_1e0 = (undefined4)*(undefined8 *)&(cctx->requestedParams).fParams.noDictIDFlag;
  uStack_1d4 = (undefined4)uVar14;
  uStack_1d0 = (undefined4)((ulong)uVar14 >> 0x20);
  uStack_1cc = (undefined4)uVar15;
  uStack_1c8 = (undefined4)((ulong)uVar15 >> 0x20);
  uVar31 = (cctx->requestedParams).nbWorkers;
  local_178._0_4_ = (cctx->requestedParams).ldmParams.hashRateLog;
  local_178._4_4_ = (cctx->requestedParams).ldmParams.windowLog;
  p_Stack_170 = (cctx->requestedParams).customMem.customAlloc;
  p_Stack_168 = (cctx->requestedParams).customMem.customFree;
  pvStack_160 = (cctx->requestedParams).customMem.opaque;
  local_198 = (cctx->requestedParams).jobSize;
  uStack_190._0_4_ = (cctx->requestedParams).overlapLog;
  uStack_190._4_4_ = (cctx->requestedParams).rsyncable;
  uStack_188._0_4_ = (cctx->requestedParams).ldmParams.enableLdm;
  uStack_188._4_4_ = (cctx->requestedParams).ldmParams.hashLog;
  uStack_180._0_4_ = (cctx->requestedParams).ldmParams.bucketSizeLog;
  uStack_180._4_4_ = (cctx->requestedParams).ldmParams.minMatchLength;
  pvVar2 = (cctx->prefixDict).dict;
  sVar20 = (cctx->prefixDict).dictSize;
  dictContentType = (cctx->prefixDict).dictContentType;
  local_208._0_4_ = uVar4;
  local_208._4_4_ = uVar5;
  uStack_200 = uVar6;
  uStack_1fc = uVar7;
  uStack_1f8 = uVar8;
  uStack_1f4 = uVar9;
  ZStack_1f0 = uVar10;
  uStack_1ec = uVar11;
  uStack_1dc = uVar12;
  uStack_1d8 = uVar13;
  ZSTD_getCParamsFromCCtxParams
            (&local_1b8,&cctx->requestedParams,0xffffffffffffffff,(cctx->localDict).dictSize);
  pvVar3 = (cctx->localDict).dict;
  if (pvVar3 == (void *)0x0) {
    if ((cctx->localDict).dictBuffer != (void *)0x0) {
      __assert_fail("dl->dictBuffer == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2da6,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("dl->cdict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2da7,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).dictSize != 0) {
      __assert_fail("dl->dictSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2da8,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
LAB_0014e6a7:
    bVar33 = true;
    local_258 = 0;
  }
  else {
    pZVar18 = (cctx->localDict).cdict;
    if (pZVar18 != (ZSTD_CDict *)0x0) {
      if (cctx->cdict != pZVar18) {
        __assert_fail("cctx->cdict == dl->cdict",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2dac,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      goto LAB_0014e6a7;
    }
    sVar24 = (cctx->localDict).dictSize;
    if (sVar24 == 0) {
      __assert_fail("dl->dictSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2db0,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (cctx->cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("cctx->cdict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2db1,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->prefixDict).dict != (void *)0x0) {
      __assert_fail("cctx->prefixDict.dict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2db2,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    in_stack_fffffffffffffd38 = (cctx->customMem).opaque;
    in_stack_fffffffffffffd28 = (cctx->customMem).customAlloc;
    in_stack_fffffffffffffd30 = (cctx->customMem).customFree;
    in_stack_fffffffffffffd1c = local_1b8.targetLength;
    in_stack_fffffffffffffd20 = local_1b8.strategy;
    in_stack_fffffffffffffd08 = local_1b8.windowLog;
    in_stack_fffffffffffffd0c = local_1b8.chainLog;
    cParams.hashLog = local_1b8.hashLog;
    cParams.windowLog = local_1b8.windowLog;
    cParams.chainLog = local_1b8.chainLog;
    cParams.searchLog = local_1b8.searchLog;
    cParams.minMatch = local_1b8.minMatch;
    cParams.targetLength = in_stack_fffffffffffffd1c;
    cParams.strategy = in_stack_fffffffffffffd20;
    pZVar18 = ZSTD_createCDict_advanced
                        (pvVar3,sVar24,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,cParams,
                         cctx->customMem);
    (cctx->localDict).cdict = pZVar18;
    in_stack_fffffffffffffd10 = local_1b8.hashLog;
    in_stack_fffffffffffffd14 = local_1b8.searchLog;
    in_stack_fffffffffffffd18 = local_1b8.minMatch;
    if (pZVar18 != (ZSTD_CDict *)0x0) {
      cctx->cdict = pZVar18;
      goto LAB_0014e6a7;
    }
    local_258 = 0xffffffffffffffc0;
    bVar33 = false;
  }
  if (bVar33) {
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    if ((pvVar2 != (void *)0x0) && (cctx->cdict != (ZSTD_CDict *)0x0)) {
      __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39af,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (endOp == ZSTD_e_end) {
      cctx->pledgedSrcSizePlusOne = input->size + 1;
    }
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)(local_208 + 4),&cctx->requestedParams,
               cctx->pledgedSrcSizePlusOne - 1,0);
    uVar28 = cctx->pledgedSrcSizePlusOne - 1;
    if (uVar28 < 0x100001) {
      uVar31 = 0;
    }
    if ((int)uVar31 < 1) {
      pZVar18 = cctx->cdict;
      uStack_118 = uStack_1c8;
      uStack_114 = uStack_1c4;
      uStack_138 = local_1e8;
      uStack_130 = uStack_1e0;
      local_12c = uStack_1dc;
      uStack_128 = uStack_1d8;
      uStack_124 = uStack_1d4;
      uStack_120 = uStack_1d0;
      uStack_11c = uStack_1cc;
      local_158 = CONCAT44(local_208._4_4_,local_208._0_4_);
      uStack_150 = CONCAT44(uStack_1fc,uStack_200);
      uStack_148 = CONCAT44(uStack_1f4,uStack_1f8);
      uStack_140 = CONCAT44(uStack_1ec,ZStack_1f0);
      local_10c = uVar31;
      local_108 = local_198;
      uStack_100 = uStack_190;
      uStack_f8 = uStack_188;
      uStack_f0 = uStack_180;
      local_e8 = local_178;
      p_Stack_e0 = p_Stack_170;
      p_Stack_d8 = p_Stack_168;
      pvStack_d0 = pvStack_160;
      puVar26 = &local_158;
      puVar27 = (undefined8 *)&stack0xfffffffffffffd08;
      for (lVar23 = 0x12; lVar23 != 0; lVar23 = lVar23 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      params_00.cParams.windowLog = in_stack_fffffffffffffd0c;
      params_00.format = in_stack_fffffffffffffd08;
      params_00.cParams.chainLog = in_stack_fffffffffffffd10;
      params_00.cParams.hashLog = in_stack_fffffffffffffd14;
      params_00.cParams.searchLog = in_stack_fffffffffffffd18;
      params_00.cParams.minMatch = in_stack_fffffffffffffd1c;
      params_00.cParams.targetLength = in_stack_fffffffffffffd20;
      params_00.cParams.strategy = in_stack_fffffffffffffd24;
      params_00.fParams._0_8_ = in_stack_fffffffffffffd28;
      params_00._40_8_ = in_stack_fffffffffffffd30;
      params_00._48_8_ = in_stack_fffffffffffffd38;
      auVar36 = in_stack_fffffffffffffd40._40_24_;
      auVar37 = in_stack_fffffffffffffd40._64_24_;
      params_00.targetCBlockSize = in_stack_fffffffffffffd40._0_8_;
      params_00.srcSizeHint = in_stack_fffffffffffffd40._8_4_;
      params_00.attachDictPref = in_stack_fffffffffffffd40._12_4_;
      params_00.literalCompressionMode = in_stack_fffffffffffffd40._16_4_;
      params_00.nbWorkers = in_stack_fffffffffffffd40._20_4_;
      params_00.jobSize = in_stack_fffffffffffffd40._24_8_;
      params_00.overlapLog = in_stack_fffffffffffffd40._32_4_;
      params_00.rsyncable = in_stack_fffffffffffffd40._36_4_;
      params_00.ldmParams.enableLdm = auVar36._0_4_;
      params_00.ldmParams.hashLog = auVar36._4_4_;
      params_00.ldmParams.bucketSizeLog = auVar36._8_4_;
      params_00.ldmParams.minMatchLength = auVar36._12_4_;
      params_00.ldmParams.hashRateLog = auVar36._16_4_;
      params_00.ldmParams.windowLog = auVar36._20_4_;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar37._0_8_;
      params_00.customMem.customFree = (ZSTD_freeFunction)auVar37._8_8_;
      params_00.customMem.opaque = (void *)auVar37._16_8_;
      sVar20 = ZSTD_resetCStream_internal
                         (cctx,pvVar2,sVar20,dictContentType,pZVar18,params_00,uVar28);
      if (0xffffffffffffff88 < sVar20) goto LAB_0014e94a;
      if (cctx->streamStage != zcss_load) {
        __assert_fail("cctx->streamStage == zcss_load",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39d0,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      bVar33 = true;
      if ((cctx->appliedParams).nbWorkers != 0) {
        __assert_fail("cctx->appliedParams.nbWorkers == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39d1,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
    }
    else {
      if (cctx->mtctx == (ZSTDMT_CCtx *)0x0) {
        pvVar3 = (cctx->customMem).opaque;
        in_stack_fffffffffffffd18 = (uint)pvVar3;
        in_stack_fffffffffffffd1c = (uint)((ulong)pvVar3 >> 0x20);
        p_Var16 = (cctx->customMem).customAlloc;
        p_Var17 = (cctx->customMem).customFree;
        in_stack_fffffffffffffd08 = (uint)p_Var16;
        in_stack_fffffffffffffd0c = (uint)((ulong)p_Var16 >> 0x20);
        in_stack_fffffffffffffd10 = (uint)p_Var17;
        in_stack_fffffffffffffd14 = (uint)((ulong)p_Var17 >> 0x20);
        cMem.customFree._4_4_ = in_stack_fffffffffffffd14;
        cMem._0_12_ = *(undefined1 (*) [12])&cctx->customMem;
        cMem.opaque._0_4_ = in_stack_fffffffffffffd18;
        cMem.opaque._4_4_ = in_stack_fffffffffffffd1c;
        pZVar19 = ZSTDMT_createCCtx_advanced(uVar31,cMem);
        cctx->mtctx = pZVar19;
        if (pZVar19 == (ZSTDMT_CCtx *)0x0) {
          sVar20 = 0xffffffffffffffc0;
          goto LAB_0014e94a;
        }
      }
      pZVar18 = cctx->cdict;
      pZVar19 = cctx->mtctx;
      uStack_88 = uStack_1c8;
      uStack_84 = uStack_1c4;
      uStack_a8 = local_1e8;
      uStack_a0 = uStack_1e0;
      local_9c = uStack_1dc;
      uStack_98 = uStack_1d8;
      uStack_94 = uStack_1d4;
      uStack_90 = uStack_1d0;
      uStack_8c = uStack_1cc;
      local_c8 = CONCAT44(local_208._4_4_,local_208._0_4_);
      uStack_c0 = CONCAT44(uStack_1fc,uStack_200);
      uStack_b8 = CONCAT44(uStack_1f4,uStack_1f8);
      uStack_b0 = CONCAT44(uStack_1ec,ZStack_1f0);
      local_7c = uVar31;
      local_78 = local_198;
      uStack_70 = uStack_190;
      uStack_68 = uStack_188;
      uStack_60 = uStack_180;
      local_58 = local_178;
      p_Stack_50 = p_Stack_170;
      p_Stack_48 = p_Stack_168;
      pvStack_40 = pvStack_160;
      uVar28 = cctx->pledgedSrcSizePlusOne;
      puVar26 = &local_c8;
      puVar27 = (undefined8 *)&stack0xfffffffffffffd08;
      for (lVar23 = 0x12; lVar23 != 0; lVar23 = lVar23 + -1) {
        *puVar27 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar35 * -2 + 1;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
      }
      params.cParams.windowLog = in_stack_fffffffffffffd0c;
      params.format = in_stack_fffffffffffffd08;
      params.cParams.chainLog = in_stack_fffffffffffffd10;
      params.cParams.hashLog = in_stack_fffffffffffffd14;
      params.cParams.searchLog = in_stack_fffffffffffffd18;
      params.cParams.minMatch = in_stack_fffffffffffffd1c;
      params.cParams.targetLength = in_stack_fffffffffffffd20;
      params.cParams.strategy = in_stack_fffffffffffffd24;
      params.fParams._0_8_ = in_stack_fffffffffffffd28;
      params._40_8_ = in_stack_fffffffffffffd30;
      params._48_8_ = in_stack_fffffffffffffd38;
      auVar36 = in_stack_fffffffffffffd40._40_24_;
      auVar37 = in_stack_fffffffffffffd40._64_24_;
      params.targetCBlockSize = in_stack_fffffffffffffd40._0_8_;
      params.srcSizeHint = in_stack_fffffffffffffd40._8_4_;
      params.attachDictPref = in_stack_fffffffffffffd40._12_4_;
      params.literalCompressionMode = in_stack_fffffffffffffd40._16_4_;
      params.nbWorkers = in_stack_fffffffffffffd40._20_4_;
      params.jobSize = in_stack_fffffffffffffd40._24_8_;
      params.overlapLog = in_stack_fffffffffffffd40._32_4_;
      params.rsyncable = in_stack_fffffffffffffd40._36_4_;
      params.ldmParams.enableLdm = auVar36._0_4_;
      params.ldmParams.hashLog = auVar36._4_4_;
      params.ldmParams.bucketSizeLog = auVar36._8_4_;
      params.ldmParams.minMatchLength = auVar36._12_4_;
      params.ldmParams.hashRateLog = auVar36._16_4_;
      params.ldmParams.windowLog = auVar36._20_4_;
      params.customMem.customAlloc = (ZSTD_allocFunction)auVar37._0_8_;
      params.customMem.customFree = (ZSTD_freeFunction)auVar37._8_8_;
      params.customMem.opaque = (void *)auVar37._16_8_;
      sVar20 = ZSTDMT_initCStream_internal
                         (pZVar19,pvVar2,sVar20,ZSTD_dct_rawContent,pZVar18,params,uVar28 - 1);
      if (sVar20 < 0xffffffffffffff89) {
        cctx->streamStage = zcss_load;
        (cctx->appliedParams).nbWorkers = uVar31;
        bVar33 = true;
      }
      else {
LAB_0014e94a:
        bVar33 = false;
        local_258 = sVar20;
      }
    }
  }
  else {
    bVar33 = false;
  }
  if (!bVar33) {
    return local_258;
  }
LAB_0014e95c:
  if ((cctx->appliedParams).nbWorkers < 1) {
    if (cctx->inBuff == (char *)0x0) {
      __assert_fail("zcs->inBuff != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x390d,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if (cctx->inBuffSize == 0) {
      __assert_fail("zcs->inBuffSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x390e,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if (cctx->outBuff == (char *)0x0) {
      __assert_fail("zcs->outBuff != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x390f,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if (cctx->outBuffSize == 0) {
      __assert_fail("zcs->outBuffSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3910,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if (output->size < output->pos) {
      __assert_fail("output->pos <= output->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3911,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    if (input->size < input->pos) {
      __assert_fail("input->pos <= input->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3912,
                    "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                   );
    }
    pvVar2 = input->src;
    pvVar25 = (void *)(input->size + (long)pvVar2);
    src = (void *)(input->pos + (long)pvVar2);
    pvVar3 = output->dst;
    pcVar29 = (char *)(output->size + (long)pvVar3);
    dst = (char *)(output->pos + (long)pvVar3);
    do {
      ZVar1 = cctx->streamStage;
      if (ZVar1 == zcss_load) {
        if (endOp == ZSTD_e_end) {
          sVar20 = (long)pvVar25 - (long)src;
          uVar21 = -(sVar20 - 0x20000) >> 0xb;
          if (0x1ffff < sVar20) {
            uVar21 = 0;
          }
          if (((ulong)((long)pcVar29 - (long)dst) < (sVar20 >> 8) + sVar20 + uVar21) ||
             (cctx->inBuffPos != 0)) goto LAB_0014ec59;
          uVar21 = ZSTD_compressEnd(cctx,dst,(long)pcVar29 - (long)dst,src,sVar20);
          bVar34 = 0xffffffffffffff88 < uVar21;
          if (bVar34) goto LAB_0014f00e;
          dst = dst + uVar21;
          cctx->streamStage = zcss_init;
          cctx->frameEnded = 1;
          cctx->pledgedSrcSizePlusOne = 0;
          src = pvVar25;
        }
        else {
LAB_0014ec59:
          uVar30 = cctx->inBuffTarget - cctx->inBuffPos;
          uVar21 = (long)pvVar25 - (long)src;
          if (uVar30 < (ulong)((long)pvVar25 - (long)src)) {
            uVar21 = uVar30;
          }
          if (uVar21 != 0) {
            memcpy(cctx->inBuff + cctx->inBuffPos,src,uVar21);
          }
          uVar30 = cctx->inBuffPos + uVar21;
          cctx->inBuffPos = uVar30;
          if (endOp == ZSTD_e_flush) {
            bVar33 = false;
            bVar34 = false;
            if (uVar30 != cctx->inToCompress) goto LAB_0014ece3;
          }
          else {
            if (endOp == ZSTD_e_continue) {
              bVar33 = false;
              bVar34 = false;
              if (uVar30 < cctx->inBuffTarget) goto LAB_0014ecea;
            }
LAB_0014ece3:
            bVar34 = true;
            bVar33 = true;
          }
LAB_0014ecea:
          src = (void *)((long)src + uVar21);
          if (bVar33) {
            sVar20 = uVar30 - cctx->inToCompress;
            uVar21 = -(sVar20 - 0x20000) >> 0xb;
            if (0x1ffff < sVar20) {
              uVar21 = 0;
            }
            sVar24 = (long)pcVar29 - (long)dst;
            dst_00 = dst;
            if (sVar24 < (sVar20 >> 8) + sVar20 + uVar21) {
              dst_00 = cctx->outBuff;
              sVar24 = cctx->outBuffSize;
            }
            if (endOp == ZSTD_e_end && src == pvVar25) {
              uVar21 = ZSTD_compressEnd(cctx,dst_00,sVar24,cctx->inBuff + cctx->inToCompress,sVar20)
              ;
            }
            else {
              uVar21 = ZSTD_compressContinue_internal
                                 (cctx,dst_00,sVar24,cctx->inBuff + cctx->inToCompress,sVar20,1,0);
            }
            iVar22 = 1;
            if (uVar21 < 0xffffffffffffff89) {
              uVar31 = (uint)(endOp == ZSTD_e_end && src == pvVar25);
              cctx->frameEnded = uVar31;
              uVar30 = cctx->inBuffPos + cctx->blockSize;
              cctx->inBuffTarget = uVar30;
              if (cctx->inBuffSize < uVar30) {
                cctx->inBuffPos = 0;
                cctx->inBuffTarget = cctx->blockSize;
              }
              if ((uVar31 == 0) && (cctx->inBuffSize < cctx->inBuffTarget)) {
                __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3955,
                              "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                             );
              }
              cctx->inToCompress = cctx->inBuffPos;
              if (dst_00 == dst) {
                dst = dst + uVar21;
                iVar22 = 4;
                uVar21 = local_248;
                if (uVar31 != 0) {
                  cctx->streamStage = zcss_init;
                  cctx->pledgedSrcSizePlusOne = 0;
                  bVar34 = false;
                }
              }
              else {
                cctx->outBuffContentSize = uVar21;
                cctx->outBuffFlushedSize = 0;
                cctx->streamStage = zcss_flush;
                iVar22 = 0;
                uVar21 = local_248;
              }
            }
            local_248 = uVar21;
            if (iVar22 != 4) {
              uVar21 = local_248;
              if (iVar22 == 0) goto LAB_0014eb7c;
              goto LAB_0014f00e;
            }
          }
        }
      }
      else {
        bVar34 = true;
        if (ZVar1 != zcss_flush) {
          local_248 = 0xffffffffffffffc2;
          uVar21 = local_248;
          if (ZVar1 != zcss_init) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3981,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          goto LAB_0014f00e;
        }
LAB_0014eb7c:
        uVar32 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
        uVar30 = (long)pcVar29 - (long)dst;
        uVar21 = uVar32;
        if (uVar30 < uVar32) {
          uVar21 = uVar30;
        }
        if (uVar21 != 0) {
          memcpy(dst,cctx->outBuff + cctx->outBuffFlushedSize,uVar21);
        }
        dst = dst + uVar21;
        cctx->outBuffFlushedSize = cctx->outBuffFlushedSize + uVar21;
        if (uVar30 < uVar32) {
          bVar34 = false;
          if (dst != pcVar29) {
            __assert_fail("op==oend",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3971,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
        }
        else {
          cctx->outBuffContentSize = 0;
          cctx->outBuffFlushedSize = 0;
          if (cctx->frameEnded == 0) {
            cctx->streamStage = zcss_load;
          }
          else {
            cctx->streamStage = zcss_init;
            cctx->pledgedSrcSizePlusOne = 0;
            bVar34 = false;
          }
        }
      }
    } while (bVar34);
    input->pos = (long)src - (long)pvVar2;
    output->pos = (long)dst - (long)pvVar3;
    if (cctx->frameEnded == 0) {
      uVar21 = cctx->inBuffTarget - cctx->inBuffPos;
      if (uVar21 == 0) {
        uVar21 = cctx->blockSize;
      }
    }
    else {
      local_248 = 0;
      uVar21 = local_248;
    }
LAB_0014f00e:
    local_248 = uVar21;
    if (local_248 < 0xffffffffffffff89) {
      local_248 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
  }
  else {
    if (ZSTD_e_end < endOp) {
      __assert_fail("forceMaxProgress || endOp == ZSTD_e_continue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39da,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (cctx->cParamsChanged != 0) {
      pZVar19 = cctx->mtctx;
      uVar31 = (pZVar19->params).cParams.windowLog;
      (pZVar19->params).compressionLevel = (cctx->requestedParams).compressionLevel;
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)local_208,&cctx->requestedParams,0xffffffffffffffff,0
                );
      (pZVar19->params).cParams.searchLog = uStack_1fc;
      (pZVar19->params).cParams.minMatch = uStack_1f8;
      (pZVar19->params).cParams.targetLength = uStack_1f4;
      (pZVar19->params).cParams.strategy = ZStack_1f0;
      (pZVar19->params).cParams.windowLog = uVar31;
      (pZVar19->params).cParams.chainLog = local_208._4_4_;
      (pZVar19->params).cParams.hashLog = uStack_200;
      (pZVar19->params).cParams.searchLog = uStack_1fc;
      cctx->cParamsChanged = 0;
      local_208._0_4_ = uVar31;
    }
    do {
      local_248 = ZSTDMT_compressStream_generic(cctx->mtctx,output,input,endOp);
      if ((0xffffffffffffff88 < local_248) || (endOp == ZSTD_e_end && local_248 == 0)) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
      }
      if (0xffffffffffffff88 < local_248) {
        return local_248;
      }
      bVar33 = 1 < endOp - ZSTD_e_flush;
      if (local_248 == 0 || bVar33) {
        return local_248;
      }
    } while (output->pos < output->size);
    if ((local_248 != 0 && !bVar33) && (output->pos != output->size)) {
      __assert_fail("!forceMaxProgress || flushMin == 0 || output->pos == output->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39eb,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
  }
  return local_248;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, GENERIC);
    RETURN_ERROR_IF(input->pos  > input->size, GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) ); /* Init the local dict if present. */
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
        DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);


#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL) {
                DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem);
                RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   FORWARD_IF_ERROR( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }
    /* end of transparent initialization stage */

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        int const forceMaxProgress = (endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
        size_t flushMin;
        assert(forceMaxProgress || endOp == ZSTD_e_continue /* Protection for a new flush type */);
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        do {
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin);
        } while (forceMaxProgress && flushMin != 0 && output->pos < output->size);
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(!forceMaxProgress || flushMin == 0 || output->pos == output->size);
        return flushMin;
    }
#endif
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}